

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::Texture2DLodControlCase::iterate(Texture2DLodControlCase *this)

{
  RenderContext *context;
  TestLog *pTVar1;
  int width;
  int height;
  undefined1 auVar2 [8];
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RenderTarget *pRVar7;
  int iVar8;
  size_t __n;
  Surface *pSVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  char *description;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  PixelFormat *format;
  allocator<char> local_49b;
  allocator<char> local_49a;
  allocator<char> local_499;
  int local_498;
  undefined4 uStack_494;
  int local_48c;
  int local_488;
  int local_484;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrec;
  Texture2DView local_410;
  ConstPixelBufferAccess local_400;
  PixelBufferAccess local_3d8;
  Texture2D *local_3a8;
  PixelBufferAccess local_3a0;
  Surface renderedFrame;
  PixelBufferAccess local_360;
  Surface errorMask;
  Surface referenceFrame;
  undefined1 local_308 [32];
  _func_int **pp_Stack_2e8;
  BVec4 local_2e0;
  LogImage local_2d8;
  undefined1 local_248 [8];
  _func_int **pp_Stack_240;
  ReferenceParams sampleParams;
  long lVar6;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  local_3a8 = this->m_texture;
  iVar3 = (local_3a8->m_refTexture).m_width;
  iVar8 = (local_3a8->m_refTexture).m_height;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar3 << 2,iVar8 << 2,dVar5);
  glu::mapGLSampler((Sampler *)local_248,0x2901,0x2901,this->m_minFilter,0x2600);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            (&sampleParams,TEXTURETYPE_2D,(Sampler *)local_248,LODMODE_EXACT);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  local_484 = viewport.width / 4;
  local_488 = viewport.height / 4;
  (*this->m_texture->_vptr_Texture2D[2])(this->m_texture,4,(long)viewport.height % 4 & 0xffffffff);
  (**(code **)(lVar6 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2802,0x2901);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2803,0x2901);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2600);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x5f5);
  local_498 = 0;
  iVar3 = 0;
  while (uStack_494 = 0, iVar3 != 4) {
    iVar8 = iVar3 * local_488;
    iVar10 = 0;
    iVar4 = 0;
    local_48c = iVar3;
    for (iVar12 = 0; iVar12 != 4; iVar12 = iVar12 + 1) {
      iVar3 = viewport.width + iVar4;
      if (iVar12 != 3) {
        iVar3 = local_484;
      }
      iVar11 = viewport.height - iVar8;
      if (local_48c != 3) {
        iVar11 = local_488;
      }
      uVar13 = local_498 + iVar12;
      getBasicTexCoord2D(&texCoord,uVar13);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,(ulong)uVar13);
      (**(code **)(lVar6 + 0x1a00))(viewport.x + iVar10,viewport.y + iVar8,iVar3,iVar11);
      iVar4 = iVar4 - local_484;
      iVar10 = iVar10 + local_484;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams.super_RenderParams);
    }
    local_498 = local_498 + 4;
    iVar3 = local_48c + 1;
  }
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_248,&renderedFrame);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_248);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Read pixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x60d);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar13 = this->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_308);
  format = &pRVar7->m_pixelFormat;
  lodPrec.rule = RULE_OPENGL;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_308._0_4_ = 0x14;
  local_308._4_4_ = 0x14;
  local_308._8_4_ = 0;
  local_308._12_4_ = 0x10;
  local_308._16_4_ = 0x10;
  local_308._20_4_ = 0;
  local_3d8.super_ConstPixelBufferAccess.m_format.order = format->redBits;
  local_3d8.super_ConstPixelBufferAccess.m_format.type = format->greenBits;
  local_3d8.super_ConstPixelBufferAccess.m_size.m_data[0] = (pRVar7->m_pixelFormat).blueBits;
  local_3d8.super_ConstPixelBufferAccess.m_size.m_data[1] = (pRVar7->m_pixelFormat).alphaBits;
  tcu::operator-((tcu *)&local_400,(Vector<int,_4> *)&local_3d8,
                 ((uVar13 & 0xfffffffe) == 0x2702) + 1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_3a0,0);
  tcu::max<int,4>((tcu *)&local_2d8,(Vector<int,_4> *)&local_400,(Vector<int,_4> *)&local_3a0);
  tcu::computeFixedPointThreshold((tcu *)local_248,(IVec4 *)&local_2d8);
  local_308._24_8_ = local_248;
  pp_Stack_2e8 = pp_Stack_240;
  glu::TextureTestUtil::getCompareMask(format);
  auVar2 = local_248;
  local_2e0.m_data[0] = (bool)local_248[0];
  local_2e0.m_data[1] = (bool)local_248[1];
  local_2e0.m_data[2] = (bool)local_248[2];
  local_2e0.m_data[3] = (bool)local_248[3];
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 8;
  iVar3 = 0;
  iVar8 = 0;
  __n = 0;
  local_248 = auVar2;
  while (iVar4 = (int)__n, iVar4 != 4) {
    iVar10 = iVar4 * local_488;
    local_498 = 0;
    iVar12 = 0;
    iVar11 = 0;
    while( true ) {
      if (iVar11 == 4) break;
      width = viewport.width + iVar12;
      if (iVar11 != 3) {
        width = local_484;
      }
      height = viewport.height - iVar10;
      if (iVar4 != 3) {
        height = local_488;
      }
      local_48c = iVar8;
      getBasicTexCoord2D(&texCoord,iVar3 + iVar11);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                (this,&sampleParams,(ulong)(uint)(iVar3 + iVar11));
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_248,&referenceFrame,format,local_498,iVar10,width,height);
      local_2d8.m_name._M_dataplus._M_p._0_4_ = (local_3a8->m_refTexture).m_view.m_numLevels;
      local_2d8.m_name._M_string_length = (size_type)(local_3a8->m_refTexture).m_view.m_levels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_248,(Texture2DView *)&local_2d8,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_2d8,&renderedFrame);
      tcu::getSubregion((PixelBufferAccess *)local_248,(PixelBufferAccess *)&local_2d8,local_498,
                        iVar10,width,height);
      tcu::Surface::getAccess(&local_3d8,&referenceFrame);
      tcu::getSubregion((PixelBufferAccess *)&local_400,&local_3d8,local_498,iVar10,width,height);
      tcu::Surface::getAccess(&local_360,&errorMask);
      tcu::getSubregion(&local_3a0,&local_360,local_498,iVar10,width,height);
      local_410.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
      local_410.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
      iVar8 = glu::TextureTestUtil::computeTextureLookupDiff
                        ((ConstPixelBufferAccess *)local_248,&local_400,&local_3a0,&local_410,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,&sampleParams,(LookupPrecision *)local_308
                         ,&lodPrec,
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                         m_watchDog);
      iVar8 = local_48c + iVar8;
      iVar12 = iVar12 - local_484;
      local_498 = local_498 + local_484;
      iVar11 = iVar11 + 1;
    }
    iVar3 = iVar3 + 4;
    __n = (size_t)(iVar4 + 1);
  }
  if (0 < iVar8) {
    local_248 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_240);
    std::operator<<((ostream *)&pp_Stack_240,"ERROR: Image verification failed, found ");
    std::ostream::operator<<((ostringstream *)&pp_Stack_240,iVar8);
    std::operator<<((ostream *)&pp_Stack_240," invalid pixels!");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_240);
  }
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"Result",(allocator<char> *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"Verification result",&local_499);
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_2d8,(string *)&local_400,(string *)&local_3d8)
  ;
  iVar3 = (int)pTVar1;
  tcu::LogImageSet::write((LogImageSet *)&local_2d8,iVar3,__buf,__n);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"Rendered",&local_49a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"Rendered image",&local_49b);
  pSVar9 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_248,(string *)&local_3a0,(string *)&local_360,pSVar9,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_248,iVar3,__buf_00,(size_t)pSVar9);
  tcu::LogImage::~LogImage((LogImage *)local_248);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_3a0);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_400);
  if (0 < iVar8) {
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"Reference",(allocator<char> *)&local_410);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"Ideal reference",&local_499);
    pSVar9 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)local_248,(string *)&local_400,(string *)&local_3d8,pSVar9,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar3 = (int)pTVar1;
    tcu::LogImage::write((LogImage *)local_248,iVar3,__buf_01,(size_t)pSVar9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"ErrorMask",&local_49a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Error mask",&local_49b)
    ;
    pSVar9 = &errorMask;
    tcu::LogImage::LogImage
              (&local_2d8,(string *)&local_3a0,(string *)&local_360,pSVar9,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_2d8,iVar3,__buf_02,(size_t)pSVar9);
    tcu::LogImage::~LogImage(&local_2d8);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_3a0);
    tcu::LogImage::~LogImage((LogImage *)local_248);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_400);
  }
  tcu::TestLog::endImageSet(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log)
  ;
  description = "Pass";
  if (iVar8 != 0) {
    description = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar8 != 0),
             description);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  return STOP;
}

Assistant:

Texture2DLodControlCase::IterateResult Texture2DLodControlCase::iterate (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();

	const deUint32				wrapS				= GL_REPEAT;
	const deUint32				wrapT				= GL_REPEAT;
	const deUint32				magFilter			= GL_NEAREST;

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();
	const int					texWidth			= refTexture.getWidth();
	const int					texHeight			= refTexture.getHeight();

	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport		viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	ReferenceParams				sampleParams		(TEXTURETYPE_2D, glu::mapGLSampler(wrapS, wrapT, m_minFilter, magFilter));
	vector<float>				texCoord;
	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	const int					gridWidth			= 4;
	const int					gridHeight			= 4;
	const int					cellWidth			= viewport.width / gridWidth;
	const int					cellHeight			= viewport.height / gridHeight;

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int				curX		= cellWidth*gridX;
			int				curY		= cellHeight*gridY;
			int				curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int				curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int				cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord2D(texCoord, cellNdx);

			// Render with GL.
			setTextureParams(cellNdx);
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

	// Compare and log.
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord2D(texCoord, cellNdx);
				getReferenceParams(sampleParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}